

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

ZIPentry * zip_load_entry(ZIPinfo *info,int zip64,PHYSFS_uint64 ofs_fixup)

{
  code *pcVar1;
  undefined1 *ptr;
  ZIPentry *entry_00;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong _len;
  undefined1 *puVar6;
  PHYSFS_uint64 *pPVar7;
  _ZIPentry **__dest;
  undefined1 auStack_f8 [8];
  undefined1 *local_f0;
  PHYSFS_uint16 local_e4;
  PHYSFS_uint16 local_e2;
  int local_e0;
  PHYSFS_uint16 len;
  PHYSFS_uint16 sig;
  int found;
  int isdir;
  char *name;
  PHYSFS_sint64 si64;
  PHYSFS_uint32 ui32;
  PHYSFS_uint16 ui16;
  PHYSFS_uint64 offset;
  PHYSFS_uint32 starting_disk;
  PHYSFS_uint32 external_attr;
  PHYSFS_uint16 commentlen;
  PHYSFS_uint16 extralen;
  ZIPentry *pZStack_a8;
  PHYSFS_uint16 fnamelen;
  ZIPentry *retval;
  ZIPentry entry;
  PHYSFS_Io *io;
  PHYSFS_uint64 ofs_fixup_local;
  int zip64_local;
  ZIPinfo *info_local;
  
  puVar6 = auStack_f8;
  entry._104_8_ = info->io;
  pZStack_a8 = (ZIPentry *)0x0;
  _found = (char *)0x0;
  _len = 0;
  iVar3 = readui32((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint32 *)&si64);
  if (iVar3 == 0) {
    info_local = (ZIPinfo *)0x0;
  }
  else if ((uint)si64 == 0x2014b50) {
    memset(&retval,0,0x70);
    iVar3 = readui16((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint16 *)&entry.offset);
    if (iVar3 == 0) {
      info_local = (ZIPinfo *)0x0;
    }
    else {
      iVar3 = readui16((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint16 *)((long)&entry.offset + 2));
      if (iVar3 == 0) {
        info_local = (ZIPinfo *)0x0;
      }
      else {
        iVar3 = readui16((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint16 *)((long)&entry.offset + 4));
        if (iVar3 == 0) {
          info_local = (ZIPinfo *)0x0;
        }
        else {
          iVar3 = readui16((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint16 *)((long)&entry.offset + 6));
          if (iVar3 == 0) {
            info_local = (ZIPinfo *)0x0;
          }
          else {
            iVar3 = readui32((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint32 *)&entry.last_mod_time);
            if (iVar3 == 0) {
              info_local = (ZIPinfo *)0x0;
            }
            else {
              entry.uncompressed_size =
                   zip_dos_time_to_physfs_time((PHYSFS_uint32)entry.last_mod_time);
              iVar3 = readui32((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint32 *)&entry.version);
              if (iVar3 == 0) {
                info_local = (ZIPinfo *)0x0;
              }
              else {
                iVar3 = readui32((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint32 *)&si64);
                if (iVar3 == 0) {
                  info_local = (ZIPinfo *)0x0;
                }
                else {
                  entry._72_8_ = ZEXT48((uint)si64);
                  iVar3 = readui32((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint32 *)&si64);
                  if (iVar3 == 0) {
                    info_local = (ZIPinfo *)0x0;
                  }
                  else {
                    entry.compressed_size = (PHYSFS_uint64)(uint)si64;
                    iVar3 = readui16((PHYSFS_Io *)entry._104_8_,
                                     (PHYSFS_uint16 *)((long)&external_attr + 2));
                    if (iVar3 == 0) {
                      info_local = (ZIPinfo *)0x0;
                    }
                    else {
                      iVar3 = readui16((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint16 *)&external_attr);
                      if (iVar3 == 0) {
                        info_local = (ZIPinfo *)0x0;
                      }
                      else {
                        iVar3 = readui16((PHYSFS_Io *)entry._104_8_,
                                         (PHYSFS_uint16 *)((long)&starting_disk + 2));
                        if (iVar3 == 0) {
                          info_local = (ZIPinfo *)0x0;
                        }
                        else {
                          iVar3 = readui16((PHYSFS_Io *)entry._104_8_,
                                           (PHYSFS_uint16 *)((long)&si64 + 6));
                          if (iVar3 == 0) {
                            info_local = (ZIPinfo *)0x0;
                          }
                          else {
                            offset._0_4_ = (uint)si64._6_2_;
                            iVar3 = readui16((PHYSFS_Io *)entry._104_8_,
                                             (PHYSFS_uint16 *)((long)&si64 + 6));
                            if (iVar3 == 0) {
                              info_local = (ZIPinfo *)0x0;
                            }
                            else {
                              iVar3 = readui32((PHYSFS_Io *)entry._104_8_,
                                               (PHYSFS_uint32 *)((long)&offset + 4));
                              if (iVar3 == 0) {
                                info_local = (ZIPinfo *)0x0;
                              }
                              else {
                                iVar3 = readui32((PHYSFS_Io *)entry._104_8_,(PHYSFS_uint32 *)&si64);
                                if (iVar3 == 0) {
                                  info_local = (ZIPinfo *)0x0;
                                }
                                else {
                                  _ui32 = (ulong)(uint)si64;
                                  if (external_attr._2_2_ + 1 < 0x100) {
                                    puVar6 = auStack_f8 +
                                             -(ulong)(external_attr._2_2_ + 0x18 & 0xfffffff0);
                                    local_f0 = puVar6;
                                  }
                                  else {
                                    local_f0 = (undefined1 *)0x0;
                                  }
                                  ptr = local_f0;
                                  uVar4 = (uint)external_attr._2_2_;
                                  *(undefined8 *)(puVar6 + -8) = 0x123088;
                                  pcVar5 = (char *)__PHYSFS_initSmallAlloc
                                                             (ptr,(long)(int)(uVar4 + 1));
                                  uVar2 = entry._104_8_;
                                  _found = pcVar5;
                                  if (pcVar5 == (char *)0x0) {
                                    *(undefined8 *)(puVar6 + -8) = 0x1230a3;
                                    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                                    info_local = (ZIPinfo *)0x0;
                                  }
                                  else {
                                    _len = (ulong)external_attr._2_2_;
                                    *(undefined8 *)(puVar6 + -8) = 0x1230cb;
                                    iVar3 = __PHYSFS_readAll((PHYSFS_Io *)uVar2,pcVar5,_len);
                                    pcVar5 = _found;
                                    if (iVar3 == 0) {
                                      *(undefined8 *)(puVar6 + -8) = 0x1230dc;
                                      __PHYSFS_smallFree(pcVar5);
                                      info_local = (ZIPinfo *)0x0;
                                    }
                                    else {
                                      if (_found[(int)(external_attr._2_2_ - 1)] == '/') {
                                        _found[(int)(external_attr._2_2_ - 1)] = '\0';
                                        _len = 1;
                                      }
                                      _found[external_attr._2_2_] = '\0';
                                      *(undefined8 *)(puVar6 + -8) = 0x12314d;
                                      zip_convert_dos_path((PHYSFS_uint16)entry.offset,pcVar5);
                                      pcVar5 = _found;
                                      iVar3 = _len;
                                      *(undefined8 *)(puVar6 + -8) = 0x123163;
                                      pZStack_a8 = (ZIPentry *)
                                                   __PHYSFS_DirTreeAdd(&info->tree,pcVar5,iVar3);
                                      pcVar5 = _found;
                                      *(undefined8 *)(puVar6 + -8) = 0x123176;
                                      __PHYSFS_smallFree(pcVar5);
                                      if (pZStack_a8 == (ZIPentry *)0x0) {
                                        *(undefined8 *)(puVar6 + -8) = 0x12318a;
                                        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                                        info_local = (ZIPinfo *)0x0;
                                      }
                                      else if (pZStack_a8->last_mod_time == 0) {
                                        __dest = &pZStack_a8->symlink;
                                        *(undefined8 *)(puVar6 + -8) = 0x1231e2;
                                        memcpy(__dest,&entry.tree.isdir,0x48);
                                        entry_00 = pZStack_a8;
                                        pZStack_a8->symlink = (_ZIPentry *)0x0;
                                        if (_len == 0) {
                                          *(undefined8 *)(puVar6 + -8) = 0x12321c;
                                          iVar3 = zip_has_symlink_attr(entry_00,offset._4_4_);
                                          pZStack_a8->resolved = (uint)(iVar3 != 0);
                                        }
                                        else {
                                          pZStack_a8->resolved = ZIP_DIRECTORY;
                                        }
                                        uVar2 = entry._104_8_;
                                        pcVar1 = *(code **)(entry._104_8_ + 0x28);
                                        *(undefined8 *)(puVar6 + -8) = 0x123243;
                                        name = (char *)(*pcVar1)(uVar2);
                                        if (name == (char *)0xffffffffffffffff) {
                                          info_local = (ZIPinfo *)0x0;
                                        }
                                        else if ((zip64 == 0) ||
                                                ((((_ui32 != 0xffffffff &&
                                                   ((uint)offset != 0xffffffff)) &&
                                                  (pZStack_a8->compressed_size != 0xffffffff)) &&
                                                 (pZStack_a8->uncompressed_size != 0xffffffff)))) {
LAB_001235a6:
                                          uVar2 = entry._104_8_;
                                          if ((uint)offset == 0) {
                                            pZStack_a8->offset = _ui32 + ofs_fixup;
                                            pcVar1 = *(code **)(entry._104_8_ + 0x20);
                                            pcVar5 = name + (ulong)starting_disk._2_2_ +
                                                            (ulong)(ushort)external_attr;
                                            *(undefined8 *)(puVar6 + -8) = 0x123606;
                                            iVar3 = (*pcVar1)(uVar2,pcVar5);
                                            if (iVar3 == 0) {
                                              info_local = (ZIPinfo *)0x0;
                                            }
                                            else {
                                              info_local = (ZIPinfo *)pZStack_a8;
                                            }
                                          }
                                          else {
                                            *(undefined8 *)(puVar6 + -8) = 0x1235bb;
                                            PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                            info_local = (ZIPinfo *)0x0;
                                          }
                                        }
                                        else {
                                          local_e0 = 0;
                                          local_e2 = 0;
                                          local_e4 = 0;
                                          do {
                                            uVar2 = entry._104_8_;
                                            if ((ushort)external_attr < 5) {
LAB_0012339e:
                                              uVar2 = entry._104_8_;
                                              if (local_e0 == 0) {
                                                *(undefined8 *)(puVar6 + -8) = 0x1233b3;
                                                PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                                return (ZIPentry *)0x0;
                                              }
                                              if (pZStack_a8->uncompressed_size == 0xffffffff) {
                                                if (local_e4 < 8) {
                                                  *(undefined8 *)(puVar6 + -8) = 0x1233ec;
                                                  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                                  return (ZIPentry *)0x0;
                                                }
                                                pPVar7 = &pZStack_a8->uncompressed_size;
                                                *(undefined8 *)(puVar6 + -8) = 0x123411;
                                                iVar3 = readui64((PHYSFS_Io *)uVar2,pPVar7);
                                                if (iVar3 == 0) {
                                                  return (ZIPentry *)0x0;
                                                }
                                                local_e4 = local_e4 - 8;
                                              }
                                              uVar2 = entry._104_8_;
                                              if (pZStack_a8->compressed_size == 0xffffffff) {
                                                if (local_e4 < 8) {
                                                  *(undefined8 *)(puVar6 + -8) = 0x123460;
                                                  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                                  return (ZIPentry *)0x0;
                                                }
                                                pPVar7 = &pZStack_a8->compressed_size;
                                                *(undefined8 *)(puVar6 + -8) = 0x123485;
                                                iVar3 = readui64((PHYSFS_Io *)uVar2,pPVar7);
                                                if (iVar3 == 0) {
                                                  return (ZIPentry *)0x0;
                                                }
                                                local_e4 = local_e4 - 8;
                                              }
                                              uVar2 = entry._104_8_;
                                              if (_ui32 == 0xffffffff) {
                                                if (local_e4 < 8) {
                                                  *(undefined8 *)(puVar6 + -8) = 0x1234d0;
                                                  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                                  return (ZIPentry *)0x0;
                                                }
                                                *(undefined8 *)(puVar6 + -8) = 0x1234f1;
                                                iVar3 = readui64((PHYSFS_Io *)uVar2,
                                                                 (PHYSFS_uint64 *)&ui32);
                                                if (iVar3 == 0) {
                                                  return (ZIPentry *)0x0;
                                                }
                                                local_e4 = local_e4 - 8;
                                              }
                                              uVar2 = entry._104_8_;
                                              if ((uint)offset == 0xffffffff) {
                                                if (local_e4 < 8) {
                                                  *(undefined8 *)(puVar6 + -8) = 0x123537;
                                                  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                                  return (ZIPentry *)0x0;
                                                }
                                                *(undefined8 *)(puVar6 + -8) = 0x123558;
                                                iVar3 = readui32((PHYSFS_Io *)uVar2,
                                                                 (PHYSFS_uint32 *)&offset);
                                                if (iVar3 == 0) {
                                                  return (ZIPentry *)0x0;
                                                }
                                                local_e4 = local_e4 - 4;
                                              }
                                              if (local_e4 != 0) {
                                                *(undefined8 *)(puVar6 + -8) = 0x123595;
                                                PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                                return (ZIPentry *)0x0;
                                              }
                                              goto LAB_001235a6;
                                            }
                                            *(undefined8 *)(puVar6 + -8) = 0x1232ea;
                                            iVar3 = readui16((PHYSFS_Io *)uVar2,&local_e2);
                                            uVar2 = entry._104_8_;
                                            if (iVar3 == 0) {
                                              return (ZIPentry *)0x0;
                                            }
                                            *(undefined8 *)(puVar6 + -8) = 0x123310;
                                            iVar3 = readui16((PHYSFS_Io *)uVar2,&local_e4);
                                            uVar2 = entry._104_8_;
                                            if (iVar3 == 0) {
                                              return (ZIPentry *)0x0;
                                            }
                                            pcVar5 = name + (int)(local_e4 + 4);
                                            external_attr._0_2_ =
                                                 (ushort)external_attr - (local_e4 + 4);
                                            name = pcVar5;
                                            if (local_e2 == 1) {
                                              local_e0 = 1;
                                              goto LAB_0012339e;
                                            }
                                            pcVar1 = *(code **)(entry._104_8_ + 0x20);
                                            *(undefined8 *)(puVar6 + -8) = 0x12337b;
                                            iVar3 = (*pcVar1)(uVar2,pcVar5);
                                          } while (iVar3 != 0);
                                          info_local = (ZIPinfo *)0x0;
                                        }
                                      }
                                      else {
                                        *(undefined8 *)(puVar6 + -8) = 0x1231b3;
                                        PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                                        info_local = (ZIPinfo *)0x0;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
    info_local = (ZIPinfo *)0x0;
  }
  return (ZIPentry *)info_local;
}

Assistant:

static ZIPentry *zip_load_entry(ZIPinfo *info, const int zip64,
                                const PHYSFS_uint64 ofs_fixup)
{
    PHYSFS_Io *io = info->io;
    ZIPentry entry;
    ZIPentry *retval = NULL;
    PHYSFS_uint16 fnamelen, extralen, commentlen;
    PHYSFS_uint32 external_attr;
    PHYSFS_uint32 starting_disk;
    PHYSFS_uint64 offset;
    PHYSFS_uint16 ui16;
    PHYSFS_uint32 ui32;
    PHYSFS_sint64 si64;
    char *name = NULL;
    int isdir = 0;

    /* sanity check with central directory signature... */
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    BAIL_IF(ui32 != ZIP_CENTRAL_DIR_SIG, PHYSFS_ERR_CORRUPT, NULL);

    memset(&entry, '\0', sizeof (entry));

    /* Get the pertinent parts of the record... */
    BAIL_IF_ERRPASS(!readui16(io, &entry.version), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &entry.version_needed), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &entry.general_bits), NULL);  /* general bits */
    BAIL_IF_ERRPASS(!readui16(io, &entry.compression_method), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &entry.dos_mod_time), NULL);
    entry.last_mod_time = zip_dos_time_to_physfs_time(entry.dos_mod_time);
    BAIL_IF_ERRPASS(!readui32(io, &entry.crc), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    entry.compressed_size = (PHYSFS_uint64) ui32;
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    entry.uncompressed_size = (PHYSFS_uint64) ui32;
    BAIL_IF_ERRPASS(!readui16(io, &fnamelen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &extralen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &commentlen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &ui16), NULL);
    starting_disk = (PHYSFS_uint32) ui16;
    BAIL_IF_ERRPASS(!readui16(io, &ui16), NULL);  /* internal file attribs */
    BAIL_IF_ERRPASS(!readui32(io, &external_attr), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    offset = (PHYSFS_uint64) ui32;

    name = (char *) __PHYSFS_smallAlloc(fnamelen + 1);
    BAIL_IF(!name, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    if (!__PHYSFS_readAll(io, name, fnamelen))
    {
        __PHYSFS_smallFree(name);
        return NULL;
    } /* if */

    if (name[fnamelen - 1] == '/')
    {
        name[fnamelen - 1] = '\0';
        isdir = 1;
    } /* if */
    name[fnamelen] = '\0';  /* null-terminate the filename. */

    zip_convert_dos_path(entry.version, name);

    retval = (ZIPentry *) __PHYSFS_DirTreeAdd(&info->tree, name, isdir);
    __PHYSFS_smallFree(name);

    BAIL_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    /* It's okay to BAIL without freeing retval, because it's stored in the
       __PHYSFS_DirTree and will be freed later anyhow. */
    BAIL_IF(retval->last_mod_time != 0, PHYSFS_ERR_CORRUPT, NULL); /* dupe? */

    /* Move the data we already read into place in the official object. */
    memcpy(((PHYSFS_uint8 *) retval) + sizeof (__PHYSFS_DirTreeEntry),
           ((PHYSFS_uint8 *) &entry) + sizeof (__PHYSFS_DirTreeEntry),
           sizeof (*retval) - sizeof (__PHYSFS_DirTreeEntry));

    retval->symlink = NULL;  /* will be resolved later, if necessary. */

    if (isdir)
        retval->resolved = ZIP_DIRECTORY;
    else
    {
        retval->resolved = (zip_has_symlink_attr(retval, external_attr)) ?
                                ZIP_UNRESOLVED_SYMLINK : ZIP_UNRESOLVED_FILE;
    } /* else */

    si64 = io->tell(io);
    BAIL_IF_ERRPASS(si64 == -1, NULL);

    /* If the actual sizes didn't fit in 32-bits, look for the Zip64
        extended information extra field... */
    if ( (zip64) &&
         ((offset == 0xFFFFFFFF) ||
          (starting_disk == 0xFFFFFFFF) ||
          (retval->compressed_size == 0xFFFFFFFF) ||
          (retval->uncompressed_size == 0xFFFFFFFF)) )
    {
        int found = 0;
        PHYSFS_uint16 sig = 0;
        PHYSFS_uint16 len = 0;
        while (extralen > 4)
        {
            BAIL_IF_ERRPASS(!readui16(io, &sig), NULL);
            BAIL_IF_ERRPASS(!readui16(io, &len), NULL);

            si64 += 4 + len;
            extralen -= 4 + len;
            if (sig != ZIP64_EXTENDED_INFO_EXTRA_FIELD_SIG)
            {
                BAIL_IF_ERRPASS(!io->seek(io, si64), NULL);
                continue;
            } /* if */

            found = 1;
            break;
        } /* while */

        BAIL_IF(!found, PHYSFS_ERR_CORRUPT, NULL);

        if (retval->uncompressed_size == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &retval->uncompressed_size), NULL);
            len -= 8;
        } /* if */

        if (retval->compressed_size == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &retval->compressed_size), NULL);
            len -= 8;
        } /* if */

        if (offset == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &offset), NULL);
            len -= 8;
        } /* if */

        if (starting_disk == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui32(io, &starting_disk), NULL);
            len -= 4;
        } /* if */

        BAIL_IF(len != 0, PHYSFS_ERR_CORRUPT, NULL);
    } /* if */

    BAIL_IF(starting_disk != 0, PHYSFS_ERR_CORRUPT, NULL);

    retval->offset = offset + ofs_fixup;

    /* seek to the start of the next entry in the central directory... */
    BAIL_IF_ERRPASS(!io->seek(io, si64 + extralen + commentlen), NULL);

    return retval;  /* success. */
}